

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O1

void __thiscall
HtmlModelSerialiserPrivate::writeHtmlVariant
          (HtmlModelSerialiserPrivate *this,QXmlStreamWriter *writer,QVariant *val)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  QByteArrayView QVar5;
  QString local_78;
  QString local_60;
  QString local_48;
  
  iVar4 = ::QVariant::typeId(val);
  if ((iVar4 - 0x1001U < 9) && ((0x121U >> (iVar4 - 0x1001U & 0x1f) & 1) != 0)) {
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"img";
    local_78.d.size = 3;
    QXmlStreamWriter::writeEmptyElement((QString *)writer);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
      }
    }
    local_60.d.d = (Data *)0x0;
    local_60.d.ptr = L"src";
    local_60.d.size = 3;
    QVar5.m_data = (storage_type *)0x16;
    QVar5.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar5);
    qVar3 = local_78.d.size;
    pcVar2 = local_78.d.ptr;
    pDVar1 = local_78.d.d;
    AbstractStringSerialiserPrivate::saveVariant
              (&local_78,&this->super_AbstractStringSerialiserPrivate,val);
    local_48.d.d = pDVar1;
    local_48.d.ptr = pcVar2;
    local_48.d.size = qVar3;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append(&local_48);
    QXmlStreamWriter::writeAttribute((QString *)writer,&local_60);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
      }
    }
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,8);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
      }
    }
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"alt";
    local_78.d.size = 3;
    local_60.d.d = (Data *)0x0;
    local_60.d.ptr = L"modelimage.png";
    local_60.d.size = 0xe;
    QXmlStreamWriter::writeAttribute((QString *)writer,&local_78);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
      }
    }
  }
  else {
    AbstractStringSerialiserPrivate::saveVariant
              (&local_78,&this->super_AbstractStringSerialiserPrivate,val);
    QXmlStreamWriter::writeCharacters((QString *)writer);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void HtmlModelSerialiserPrivate::writeHtmlVariant(QXmlStreamWriter &writer, const QVariant &val) const
{
    if (isImageType(val.userType())) {
        writer.writeEmptyElement(QStringLiteral("img"));
        writer.writeAttribute(QStringLiteral("src"), QLatin1String("data:image/png;base64,") + saveVariant(val));
        writer.writeAttribute(QStringLiteral("alt"), QStringLiteral("modelimage.png"));
        return;
    }
    writer.writeCharacters(saveVariant(val));
}